

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Pred2_Test::Body
          (iu_SyntaxTest_x_iutest_x_Pred2_Test *this)

{
  Fixed *pFVar1;
  int in_stack_fffffffffffffe10;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::AssertPred2Helper<bool(*)(int,int),int,int>
            (&iutest_ar,(iutest *)"IsGreater","3","x",(char *)IsGreater,(_func_bool_int_int *)0x3,1,
             in_stack_fffffffffffffe10);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,1);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x241,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&iutest_ar,(iutest *)"IsGreater","3","x",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe10);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,1);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x243,iutest_ar.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&iutest_ar,(iutest *)"IsGreater","3","x",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe10);
    if (iutest_ar.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,1);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x245,iutest_ar.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iutest::AssertPred2Helper<bool(*)(int,int),int,int>
              (&iutest_ar,(iutest *)"IsGreater","3","x",(char *)IsGreater,(_func_bool_int_int *)0x3,
               1,in_stack_fffffffffffffe10);
    if (iutest_ar.m_result != false) goto LAB_002e46e9;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,1);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x247,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002e46e9:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred2)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED2(IsGreater, 3, x) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED2(IsGreater, 3, x) << x;
}